

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

FIELD * Sorted_Next_Field(FIELD *field)

{
  FIELD *pFVar1;
  FIELD *field_on_page;
  
  pFVar1 = field;
  do {
    pFVar1 = pFVar1->snext;
    if (pFVar1 == field) {
      return pFVar1;
    }
  } while ((pFVar1->opts & 3U) != 3);
  return pFVar1;
}

Assistant:

INLINE static FIELD *Sorted_Next_Field(FIELD * field)
{
  FIELD *field_on_page = field;

  do
    {
      field_on_page = field_on_page->snext;
      if (Field_Is_Selectable(field_on_page))
        break;
    } while(field_on_page!=field);
  
  return (field_on_page);
}